

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

void __thiscall
QCborContainerPrivate::appendByteData
          (QCborContainerPrivate *this,char *data,qsizetype len,Type type,ValueFlags extraFlags)

{
  long lVar1;
  rvalue_ref t;
  undefined4 in_ECX;
  long in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QFlagsStorage<QtCbor::Element::ValueFlag> f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  f.i = (Int)((ulong)(in_RDI + 0x28) >> 0x20);
  t = (rvalue_ref)
      addByteData((QCborContainerPrivate *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,0x13961e);
  QtCbor::operator|(0,(QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)SUB84((ulong)t >> 0x20,0))
  ;
  QtCbor::Element::Element
            ((Element *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),(qint64)t,Integer,(ValueFlags)f.i
            );
  QList<QtCbor::Element>::append
            ((QList<QtCbor::Element> *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendByteData(const char *data, qsizetype len, QCborValue::Type type,
                        QtCbor::Element::ValueFlags extraFlags = {})
    {
        elements.append(QtCbor::Element(addByteData(data, len), type,
                                        QtCbor::Element::HasByteData | extraFlags));
    }